

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerCallDirect(Lowerer *this,Instr *instr)

{
  _func_int **pp_Var1;
  Func *func;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  byte bVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  Opnd *this_00;
  Instr *pIVar8;
  ushort callflags;
  
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  OVar3 = IR::Opnd::GetKind(pOVar6);
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a366e;
    *puVar7 = 0;
  }
  pp_Var1 = pOVar6[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a366e;
    *puVar7 = 0;
  }
  pIVar8 = (Instr *)pp_Var1[5];
  if (pIVar8->m_opcode != ArgOut_A_InlineSpecialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3002,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
    if (!bVar4) goto LAB_005a366e;
    *puVar7 = 0;
  }
  pOVar6 = IR::Instr::UnlinkSrc1(pIVar8);
  this_00 = IR::Instr::UnlinkSrc2(pIVar8);
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005a366e;
    *puVar7 = 0;
  }
  func = instr->m_func;
  if (this_00->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005a366e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar5 = this_00->field_0xb;
  if ((bVar5 & 2) != 0) {
    this_00 = IR::Opnd::Copy(this_00,func);
    bVar5 = this_00->field_0xb;
  }
  this_00->field_0xb = bVar5 | 2;
  instr->m_src2 = this_00;
  IR::Instr::Remove(pIVar8);
  if ((instr->field_0x38 & 0x10) != 0) {
    bVar4 = IR::Instr::HasLazyBailOut(instr);
    if (!bVar4) {
      pIVar8 = SplitBailOnImplicitCall(this,instr,instr->m_next,instr->m_next);
      LowerBailoutCheckAndLabel(this,pIVar8,pIVar8->m_opcode == BailOnEqual,false);
      GenerateBailOut(this,pIVar8,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
  }
  callflags = 2;
  if (instr->m_dst == (Opnd *)0x0) {
    callflags = 0x10;
  }
  pIVar8 = GenerateDirectCall(this,instr,pOVar6,callflags);
  return pIVar8;
}

Assistant:

IR::Instr *
Lowerer::LowerCallDirect(IR::Instr * instr)
{
    IR::Opnd* linkOpnd = instr->UnlinkSrc2();
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    IR::Instr* argInstr = linkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized);
    IR::Opnd* funcObj = argInstr->UnlinkSrc1();
    instr->SetSrc2(argInstr->UnlinkSrc2());
    argInstr->Remove();

    if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
    {
        IR::Instr * bailOutInstr = this->SplitBailOnImplicitCall(instr, instr->m_next, instr->m_next);
        this->LowerBailOnEqualOrNotEqual(bailOutInstr);
    }
    Js::CallFlags flags = instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed;
    return this->GenerateDirectCall(instr, funcObj, (ushort)flags);
}